

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O0

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  byte bVar2;
  qsizetype qVar3;
  const_reference pVVar4;
  long lVar5;
  XmlOutput *pXVar6;
  undefined4 in_register_00000034;
  VCProject *this_00;
  long in_FS_OFFSET;
  int x_1;
  int x;
  VCConfiguration *config_1;
  int i_4;
  triState generateManifest;
  triState ts_1;
  VCConfiguration *config;
  int i_3;
  int i_2;
  int i_1;
  int i;
  XmlOutput xmlFilter;
  QTextStream ts;
  QFile filterFile;
  QString condition;
  undefined4 in_stack_ffffffffffffdff8;
  OpenModeFlag in_stack_ffffffffffffdffc;
  VCConfiguration *in_stack_ffffffffffffe000;
  QTextStream *in_stack_ffffffffffffe008;
  XmlOutput *in_stack_ffffffffffffe010;
  QString *in_stack_ffffffffffffe018;
  VCConfiguration *in_stack_ffffffffffffe028;
  QString *in_stack_ffffffffffffe030;
  VCProject *in_stack_ffffffffffffe038;
  VCProject *in_stack_ffffffffffffe040;
  xml_output *in_stack_ffffffffffffe048;
  xml_output *o;
  XmlOutput *in_stack_ffffffffffffe050;
  VCProject *xmlFilter_00;
  XmlOutput *in_stack_ffffffffffffe058;
  VCProject *in_stack_ffffffffffffe060;
  VCProject *project;
  int local_1c38;
  int local_1c34;
  int local_1c1c;
  int local_1c08;
  int local_1c04;
  int local_1c00;
  int local_1bfc;
  undefined1 local_16c8 [96];
  undefined8 local_1668;
  undefined8 local_1660;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_1654;
  undefined8 local_1638;
  undefined8 local_1630;
  undefined8 local_c90;
  undefined8 local_c88;
  undefined8 local_c80;
  long local_8;
  
  this_00 = (VCProject *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = QList<VCProjectSingleConfig>::size((QList<VCProjectSingleConfig> *)((long)__buf + 0xf0));
  if (qVar3 == 0) {
    warn_msg(WarnLogic,"Generator: .NET: no single project in merge project, no output");
  }
  else {
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    XmlOutput::setIndentString
              ((XmlOutput *)in_stack_ffffffffffffe000,
               (QString *)CONCAT44(in_stack_ffffffffffffdffc,in_stack_ffffffffffffdff8));
    QString::~QString((QString *)0x23f4ac);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    decl((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    tag(in_stack_ffffffffffffe018);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    QList<VCProjectSingleConfig>::first((QList<VCProjectSingleConfig> *)in_stack_ffffffffffffe000);
    attrTagToolsVersion(in_stack_ffffffffffffe000);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    tag(in_stack_ffffffffffffe018);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x23f72a);
    QString::~QString((QString *)0x23f737);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x23f751);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x23f76b);
    QString::~QString((QString *)0x23f778);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x23f79f);
    QString::~QString((QString *)0x23f7ac);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x23f7c6);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x23f7e0);
    QString::~QString((QString *)0x23f7ed);
    for (local_1bfc = 0;
        qVar3 = QList<VCProjectSingleConfig>::size
                          ((QList<VCProjectSingleConfig> *)((long)__buf + 0xf0)), local_1bfc < qVar3
        ; local_1bfc = local_1bfc + 1) {
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      tag(in_stack_ffffffffffffe018);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      QList<VCProjectSingleConfig>::at
                ((QList<VCProjectSingleConfig> *)in_stack_ffffffffffffe000,
                 CONCAT44(in_stack_ffffffffffffdffc,in_stack_ffffffffffffdff8));
      attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      QList<VCProjectSingleConfig>::at
                ((QList<VCProjectSingleConfig> *)in_stack_ffffffffffffe000,
                 CONCAT44(in_stack_ffffffffffffdffc,in_stack_ffffffffffffdff8));
      tagValue((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      QList<VCProjectSingleConfig>::at
                ((QList<VCProjectSingleConfig> *)in_stack_ffffffffffffe000,
                 CONCAT44(in_stack_ffffffffffffdffc,in_stack_ffffffffffffdff8));
      tagValue((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      closetag();
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x23fa1b);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x23fa35);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x23fa4f);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x23fa69);
    }
    closetag();
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    tag(in_stack_ffffffffffffe018);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    tagValue((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    tagValue((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    tagValue((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x23fc65);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x23fc7f);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x23fc99);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x23fcb3);
    QString::~QString((QString *)0x23fcc0);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x23fcda);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    bVar1 = QString::isEmpty((QString *)0x23fcfb);
    if (!bVar1) {
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      tagValue((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x23fd76);
    }
    bVar1 = QString::isEmpty((QString *)0x23fd8a);
    if (!bVar1) {
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      tagValue((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x23fe05);
    }
    closetag();
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    import((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x23fec8);
    QString::~QString((QString *)0x23fed5);
    for (local_1c00 = 0;
        qVar3 = QList<VCProjectSingleConfig>::size
                          ((QList<VCProjectSingleConfig> *)((long)__buf + 0xf0)), local_1c00 < qVar3
        ; local_1c00 = local_1c00 + 1) {
      pVVar4 = QList<VCProjectSingleConfig>::at
                         ((QList<VCProjectSingleConfig> *)in_stack_ffffffffffffe000,
                          CONCAT44(in_stack_ffffffffffffdffc,in_stack_ffffffffffffdff8));
      (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[0xe])
                (this,this_00,&pVVar4->Configuration);
    }
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    import((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x23fffa);
    QString::~QString((QString *)0x240007);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    tag(in_stack_ffffffffffffe018);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    closetag();
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x240108);
    QString::~QString((QString *)0x240115);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x24012f);
    for (local_1c04 = 0;
        qVar3 = QList<VCProjectSingleConfig>::size
                          ((QList<VCProjectSingleConfig> *)((long)__buf + 0xf0)), local_1c04 < qVar3
        ; local_1c04 = local_1c04 + 1) {
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      tag(in_stack_ffffffffffffe018);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      QList<VCProjectSingleConfig>::at
                ((QList<VCProjectSingleConfig> *)in_stack_ffffffffffffe000,
                 CONCAT44(in_stack_ffffffffffffdffc,in_stack_ffffffffffffdff8));
      generateCondition(in_stack_ffffffffffffe028);
      attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x2402bd);
      QString::~QString((QString *)0x2402ca);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x2402e4);
      QString::~QString((QString *)0x2402f1);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x24030b);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      tag(in_stack_ffffffffffffe018);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      closetag();
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      closetag();
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x2404a5);
      QString::~QString((QString *)0x2404b2);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x2404cc);
      QString::~QString((QString *)0x2404d9);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x2404f3);
    }
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    tag(in_stack_ffffffffffffe018);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    closetag();
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x24060a);
    QString::~QString((QString *)0x240617);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x240631);
    QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
    tag(in_stack_ffffffffffffe018);
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    QString::~QString((QString *)0x240699);
    for (local_1c08 = 0;
        qVar3 = QList<VCProjectSingleConfig>::size
                          ((QList<VCProjectSingleConfig> *)((long)__buf + 0xf0)), local_1c08 < qVar3
        ; local_1c08 = local_1c08 + 1) {
      pVVar4 = QList<VCProjectSingleConfig>::at
                         ((QList<VCProjectSingleConfig> *)in_stack_ffffffffffffe000,
                          CONCAT44(in_stack_ffffffffffffdffc,in_stack_ffffffffffffdff8));
      local_c90 = 0xaaaaaaaaaaaaaaaa;
      local_c88 = 0xaaaaaaaaaaaaaaaa;
      local_c80 = 0xaaaaaaaaaaaaaaaa;
      generateCondition(in_stack_ffffffffffffe028);
      bVar1 = QString::isEmpty((QString *)0x24076e);
      if (!bVar1) {
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        tag(in_stack_ffffffffffffe018);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        valueTag(in_stack_ffffffffffffe018);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x240872);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x24088c);
      }
      bVar1 = QString::isEmpty((QString *)0x24089d);
      if (!bVar1) {
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        tag(in_stack_ffffffffffffe018);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        valueTag(in_stack_ffffffffffffe018);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x24099e);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x2409b8);
      }
      bVar1 = QString::isEmpty((QString *)0x2409cc);
      if (!bVar1) {
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        tag(in_stack_ffffffffffffe018);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        valueTag(in_stack_ffffffffffffe018);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x240ad0);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x240aea);
      }
      bVar1 = QString::isEmpty((QString *)0x240afe);
      if (!bVar1) {
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        tag(in_stack_ffffffffffffe018);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        valueTag(in_stack_ffffffffffffe018);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x240c02);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x240c1c);
      }
      if ((pVVar4->Configuration).linker.IgnoreImportLibrary != unset) {
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        tag(in_stack_ffffffffffffe018);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        valueTagT((triState)((ulong)in_stack_ffffffffffffe008 >> 0x20));
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x240d2c);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x240d46);
      }
      if ((pVVar4->Configuration).linker.LinkIncremental != linkIncrementalDefault) {
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        tag(in_stack_ffffffffffffe018);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        valueTagT((triState)((ulong)in_stack_ffffffffffffe008 >> 0x20));
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x240e71);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x240e8b);
      }
      if ((pVVar4->Configuration).linker.GenerateManifest != unset) {
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        tag(in_stack_ffffffffffffe018);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        valueTagT((triState)((ulong)in_stack_ffffffffffffe008 >> 0x20));
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x240fa2);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x240fbc);
      }
      if ((pVVar4->Configuration).preBuild.super_VCEventTool.ExcludedFromBuild != unset) {
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        tag(in_stack_ffffffffffffe018);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        operator!(&(pVVar4->Configuration).preBuild.super_VCEventTool.ExcludedFromBuild);
        valueTagT((triState)((ulong)in_stack_ffffffffffffe008 >> 0x20));
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x2410d8);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x2410f2);
      }
      if ((pVVar4->Configuration).preLink.super_VCEventTool.ExcludedFromBuild != unset) {
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        tag(in_stack_ffffffffffffe018);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        operator!(&(pVVar4->Configuration).preLink.super_VCEventTool.ExcludedFromBuild);
        valueTagT((triState)((ulong)in_stack_ffffffffffffe008 >> 0x20));
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x24120e);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x241228);
      }
      if ((pVVar4->Configuration).postBuild.super_VCEventTool.ExcludedFromBuild != unset) {
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        tag(in_stack_ffffffffffffe018);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
        attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        operator!(&(pVVar4->Configuration).postBuild.super_VCEventTool.ExcludedFromBuild);
        valueTagT((triState)((ulong)in_stack_ffffffffffffe008 >> 0x20));
        XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x241344);
        XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
        QString::~QString((QString *)0x24135e);
      }
      QString::~QString((QString *)0x24136b);
    }
    closetag();
    XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
    XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
    for (local_1c1c = 0;
        qVar3 = QList<VCProjectSingleConfig>::size
                          ((QList<VCProjectSingleConfig> *)((long)__buf + 0xf0)), local_1c1c < qVar3
        ; local_1c1c = local_1c1c + 1) {
      pVVar4 = QList<VCProjectSingleConfig>::at
                         ((QList<VCProjectSingleConfig> *)in_stack_ffffffffffffe000,
                          CONCAT44(in_stack_ffffffffffffdffc,in_stack_ffffffffffffdff8));
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      tag(in_stack_ffffffffffffe018);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      generateCondition(in_stack_ffffffffffffe028);
      attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x24150a);
      QString::~QString((QString *)0x241517);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x241531);
      (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[4])
                (this,this_00,&(pVVar4->Configuration).compiler);
      if ((pVVar4->Configuration).ConfigurationType == typeStaticLibrary) {
        (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[9])
                  (this,this_00,&(pVVar4->Configuration).librarian);
      }
      else {
        (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[5])
                  (this,this_00,&(pVVar4->Configuration).linker);
      }
      (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[7])
                (this,this_00,&(pVVar4->Configuration).idl);
      (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[10])
                (this,this_00,&(pVVar4->Configuration).resource);
      if ((pVVar4->Configuration).postBuild.super_VCEventTool.ExcludedFromBuild != unset) {
        (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[0xb])
                  (this,this_00,&(pVVar4->Configuration).postBuild);
      }
      if ((pVVar4->Configuration).preBuild.super_VCEventTool.ExcludedFromBuild != unset) {
        (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[0xb])
                  (this,this_00,&(pVVar4->Configuration).preBuild);
      }
      if ((pVVar4->Configuration).preLink.super_VCEventTool.ExcludedFromBuild != unset) {
        (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[0xb])
                  (this,this_00,&(pVVar4->Configuration).preLink);
      }
      closetag();
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      if (((pVVar4->Configuration).windeployqt.ExcludedFromBuild & 1U) == 0) {
        (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[0xd])
                  (this,this_00,&(pVVar4->Configuration).windeployqt);
      }
    }
    local_1638 = 0xaaaaaaaaaaaaaaaa;
    local_1630 = 0xaaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_1638);
    QFile::fileName();
    QString::append((QString *)in_stack_ffffffffffffe000,(char *)in_stack_ffffffffffffe018);
    QFile::setFileName((QString *)&local_1638);
    QString::~QString((QString *)0x241799);
    local_1654.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
         (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
         operator|((enum_type)((ulong)in_stack_ffffffffffffe000 >> 0x20),
                   (enum_type)in_stack_ffffffffffffe000);
    QFlags<QIODeviceBase::OpenModeFlag>::operator|
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffe000,
               in_stack_ffffffffffffdffc);
    bVar2 = QFile::open((QFlags_conflict *)&local_1638);
    if (((bVar2 ^ 0xff) & 1) == 0) {
      local_1668 = 0xaaaaaaaaaaaaaaaa;
      local_1660 = 0xaaaaaaaaaaaaaaaa;
      QTextStream::QTextStream((QTextStream *)&local_1668,(QIODevice *)&local_1638);
      memset(local_16c8,0xaa,0x60);
      XmlOutput::XmlOutput
                (in_stack_ffffffffffffe010,in_stack_ffffffffffffe008,
                 (ConverstionType)((ulong)in_stack_ffffffffffffe000 >> 0x20));
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      XmlOutput::setIndentString
                ((XmlOutput *)in_stack_ffffffffffffe000,
                 (QString *)CONCAT44(in_stack_ffffffffffffdffc,in_stack_ffffffffffffdff8));
      QString::~QString((QString *)0x24189e);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      decl((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      tag(in_stack_ffffffffffffe018);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      QList<VCProjectSingleConfig>::first((QList<VCProjectSingleConfig> *)in_stack_ffffffffffffe000)
      ;
      attrTagToolsVersion(in_stack_ffffffffffffe000);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      attrTag((QString *)in_stack_ffffffffffffe008,(QString *)in_stack_ffffffffffffe000);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x241a02);
      QString::~QString((QString *)0x241a0f);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x241a36);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x241a50);
      QString::~QString((QString *)0x241a5d);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      tag(in_stack_ffffffffffffe018);
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      QString::~QString((QString *)0x241ab5);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      addFilters(in_stack_ffffffffffffe040,(XmlOutput *)in_stack_ffffffffffffe038,
                 in_stack_ffffffffffffe030);
      QString::~QString((QString *)0x241b03);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      addFilters(in_stack_ffffffffffffe040,(XmlOutput *)in_stack_ffffffffffffe038,
                 in_stack_ffffffffffffe030);
      QString::~QString((QString *)0x241b51);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      addFilters(in_stack_ffffffffffffe040,(XmlOutput *)in_stack_ffffffffffffe038,
                 in_stack_ffffffffffffe030);
      QString::~QString((QString *)0x241b9f);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      addFilters(in_stack_ffffffffffffe040,(XmlOutput *)in_stack_ffffffffffffe038,
                 in_stack_ffffffffffffe030);
      QString::~QString((QString *)0x241bed);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      addFilters(in_stack_ffffffffffffe040,(XmlOutput *)in_stack_ffffffffffffe038,
                 in_stack_ffffffffffffe030);
      QString::~QString((QString *)0x241c3b);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      addFilters(in_stack_ffffffffffffe040,(XmlOutput *)in_stack_ffffffffffffe038,
                 in_stack_ffffffffffffe030);
      QString::~QString((QString *)0x241c89);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      addFilters(in_stack_ffffffffffffe040,(XmlOutput *)in_stack_ffffffffffffe038,
                 in_stack_ffffffffffffe030);
      QString::~QString((QString *)0x241cd7);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      addFilters(in_stack_ffffffffffffe040,(XmlOutput *)in_stack_ffffffffffffe038,
                 in_stack_ffffffffffffe030);
      QString::~QString((QString *)0x241d25);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      addFilters(in_stack_ffffffffffffe040,(XmlOutput *)in_stack_ffffffffffffe038,
                 in_stack_ffffffffffffe030);
      QString::~QString((QString *)0x241d73);
      for (local_1c34 = 0; qVar3 = QList<QString>::size((QList<QString> *)((long)__buf + 0x108)),
          local_1c34 < qVar3; local_1c34 = local_1c34 + 1) {
        QList<QString>::at((QList<QString> *)in_stack_ffffffffffffe000,
                           CONCAT44(in_stack_ffffffffffffdffc,in_stack_ffffffffffffdff8));
        addFilters(in_stack_ffffffffffffe040,(XmlOutput *)in_stack_ffffffffffffe038,
                   in_stack_ffffffffffffe030);
      }
      closetag();
      XmlOutput::operator<<(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048);
      XmlOutput::xml_output::~xml_output((xml_output *)in_stack_ffffffffffffe000);
      o = (xml_output *)__buf;
      xmlFilter_00 = this_00;
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      outputFilter(in_stack_ffffffffffffe060,in_stack_ffffffffffffe058,(XmlOutput *)xmlFilter_00,
                   (QString *)o);
      QString::~QString((QString *)0x241e95);
      pXVar6 = (XmlOutput *)__buf;
      project = this_00;
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      outputFilter(project,pXVar6,(XmlOutput *)xmlFilter_00,(QString *)o);
      QString::~QString((QString *)0x241eef);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      outputFilter(project,pXVar6,(XmlOutput *)xmlFilter_00,(QString *)o);
      QString::~QString((QString *)0x241f49);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      outputFilter(project,pXVar6,(XmlOutput *)xmlFilter_00,(QString *)o);
      QString::~QString((QString *)0x241faf);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      outputFilter(project,pXVar6,(XmlOutput *)xmlFilter_00,(QString *)o);
      QString::~QString((QString *)0x242015);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      outputFilter(project,pXVar6,(XmlOutput *)xmlFilter_00,(QString *)o);
      QString::~QString((QString *)0x24207b);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      outputFilter(project,pXVar6,(XmlOutput *)xmlFilter_00,(QString *)o);
      QString::~QString((QString *)0x2420e1);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      outputFilter(project,pXVar6,(XmlOutput *)xmlFilter_00,(QString *)o);
      QString::~QString((QString *)0x242147);
      QString::QString((QString *)in_stack_ffffffffffffe008,(char *)in_stack_ffffffffffffe038);
      outputFilter(project,pXVar6,(XmlOutput *)xmlFilter_00,(QString *)o);
      QString::~QString((QString *)0x2421ad);
      local_1c38 = 0;
      while( true ) {
        lVar5 = (long)local_1c38;
        qVar3 = QList<QString>::size((QList<QString> *)((long)__buf + 0x108));
        if (qVar3 <= lVar5) break;
        in_stack_ffffffffffffe038 = this_00;
        QList<QString>::at((QList<QString> *)in_stack_ffffffffffffe000,
                           CONCAT44(in_stack_ffffffffffffdffc,in_stack_ffffffffffffdff8));
        outputFilter(project,pXVar6,(XmlOutput *)xmlFilter_00,(QString *)o);
        local_1c38 = local_1c38 + 1;
      }
      QString::QString((QString *)this_00,(char *)in_stack_ffffffffffffe038);
      outputFilter(project,pXVar6,(XmlOutput *)xmlFilter_00,(QString *)o);
      QString::~QString((QString *)0x2422a6);
      QString::QString(&this_00->Name,(char *)in_stack_ffffffffffffe038);
      QString::QString(&this_00->Name,(char *)in_stack_ffffffffffffe038);
      import(&this_00->Name,(QString *)__buf);
      pXVar6 = XmlOutput::operator<<((XmlOutput *)xmlFilter_00,o);
      QString::QString(&this_00->Name,(char *)in_stack_ffffffffffffe038);
      tag((QString *)pXVar6);
      XmlOutput::operator<<((XmlOutput *)xmlFilter_00,o);
      QString::QString(&this_00->Name,(char *)in_stack_ffffffffffffe038);
      QString::QString(&this_00->Name,(char *)in_stack_ffffffffffffe038);
      attrTag(&this_00->Name,(QString *)__buf);
      XmlOutput::operator<<((XmlOutput *)xmlFilter_00,o);
      closetag();
      XmlOutput::operator<<((XmlOutput *)xmlFilter_00,o);
      XmlOutput::xml_output::~xml_output((xml_output *)__buf);
      XmlOutput::xml_output::~xml_output((xml_output *)__buf);
      QString::~QString((QString *)0x2423f1);
      QString::~QString((QString *)0x2423fe);
      XmlOutput::xml_output::~xml_output((xml_output *)__buf);
      QString::~QString((QString *)0x242418);
      XmlOutput::xml_output::~xml_output((xml_output *)__buf);
      QString::~QString((QString *)0x242432);
      QString::~QString((QString *)0x24243f);
      XmlOutput::~XmlOutput((XmlOutput *)__buf);
      QTextStream::~QTextStream((QTextStream *)&local_1668);
    }
    else {
      warn_msg(WarnLogic,"Cannot open output filter file");
    }
    QFile::~QFile((QFile *)&local_1638);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, VCProject &tool)
{
    if (tool.SingleProjects.size() == 0) {
        warn_msg(WarnLogic, "Generator: .NET: no single project in merge project, no output");
        return;
    }

    xml.setIndentString("  ");

    xml << decl("1.0", "utf-8")
        << tag("Project")
        << attrTag("DefaultTargets","Build")
        << attrTagToolsVersion(tool.SingleProjects.first().Configuration)
        << attrTag("xmlns", "http://schemas.microsoft.com/developer/msbuild/2003")
        << tag("ItemGroup")
        << attrTag("Label", "ProjectConfigurations");

    for (int i = 0; i < tool.SingleProjects.size(); ++i) {
        xml << tag("ProjectConfiguration")
            << attrTag("Include" , tool.SingleProjects.at(i).Configuration.Name)
            << tagValue("Configuration", tool.SingleProjects.at(i).Configuration.ConfigurationName)
            << tagValue("Platform", tool.SingleProjects.at(i).PlatformName)
            << closetag();
    }

    xml << closetag()
        << tag("PropertyGroup")
        << attrTag("Label", "Globals")
        << tagValue("ProjectGuid", tool.ProjectGUID)
        << tagValue("RootNamespace", tool.Name)
        << tagValue("Keyword", tool.Keyword);

    if (!tool.WindowsTargetPlatformVersion.isEmpty())
        xml << tagValue("WindowsTargetPlatformVersion", tool.WindowsTargetPlatformVersion);
    if (!tool.WindowsTargetPlatformMinVersion.isEmpty())
        xml << tagValue("WindowsTargetPlatformMinVersion", tool.WindowsTargetPlatformMinVersion);

    xml << closetag();

    // config part.
    xml << import("Project", "$(VCTargetsPath)\\Microsoft.Cpp.Default.props");
    for (int i = 0; i < tool.SingleProjects.size(); ++i)
        write(xml, tool.SingleProjects.at(i).Configuration);
    xml << import("Project", "$(VCTargetsPath)\\Microsoft.Cpp.props");

    // Extension settings
    xml << tag("ImportGroup")
        << attrTag("Label", "ExtensionSettings")
        << closetag();

    // PropertySheets
    for (int i = 0; i < tool.SingleProjects.size(); ++i) {
        xml << tag("ImportGroup")
            << attrTag("Condition", generateCondition(tool.SingleProjects.at(i).Configuration))
            << attrTag("Label", "PropertySheets");

        xml << tag("Import")
            << attrTag("Project", "$(UserRootDir)\\Microsoft.Cpp.$(Platform).user.props")
            << attrTag("Condition", "exists('$(UserRootDir)\\Microsoft.Cpp.$(Platform).user.props')")
            << closetag()
            << closetag();
    }

    // UserMacros
    xml << tag("PropertyGroup")
        << attrTag("Label", "UserMacros")
        << closetag();

    xml << tag("PropertyGroup");
    for (int i = 0; i < tool.SingleProjects.size(); ++i) {
        const VCConfiguration &config = tool.SingleProjects.at(i).Configuration;
        const QString condition = generateCondition(config);

        if (!config.OutputDirectory.isEmpty()) {
            xml << tag("OutDir")
                << attrTag("Condition", condition)
                << valueTag(config.OutputDirectory);
        }
        if (!config.IntermediateDirectory.isEmpty()) {
            xml << tag("IntDir")
                << attrTag("Condition", condition)
                << valueTag(config.IntermediateDirectory);
        }
        if (!config.PrimaryOutput.isEmpty()) {
            xml << tag("TargetName")
                << attrTag("Condition", condition)
                << valueTag(config.PrimaryOutput);
        }
        if (!config.PrimaryOutputExtension.isEmpty()) {
            xml << tag("TargetExt")
                << attrTag("Condition", condition)
                << valueTag(config.PrimaryOutputExtension);
        }
        if (config.linker.IgnoreImportLibrary != unset) {
            xml << tag("IgnoreImportLibrary")
                << attrTag("Condition", condition)
                << valueTagT(config.linker.IgnoreImportLibrary);
        }

        if (config.linker.LinkIncremental != linkIncrementalDefault) {
            const triState ts = (config.linker.LinkIncremental == linkIncrementalYes ? _True : _False);
            xml << tag("LinkIncremental")
                << attrTag("Condition", condition)
                << valueTagT(ts);
        }

        const triState generateManifest = config.linker.GenerateManifest;
        if (generateManifest != unset) {
            xml << tag("GenerateManifest")
                << attrTag("Condition", condition)
                << valueTagT(generateManifest);
        }

        if (config.preBuild.ExcludedFromBuild != unset)
        {
            xml << tag("PreBuildEventUseInBuild")
                << attrTag("Condition", condition)
                << valueTagT(!config.preBuild.ExcludedFromBuild);
        }

        if (config.preLink.ExcludedFromBuild != unset)
        {
            xml << tag("PreLinkEventUseInBuild")
                << attrTag("Condition", condition)
                << valueTagT(!config.preLink.ExcludedFromBuild);
        }

        if (config.postBuild.ExcludedFromBuild != unset)
        {
            xml << tag("PostBuildEventUseInBuild")
                << attrTag("Condition", condition)
                << valueTagT(!config.postBuild.ExcludedFromBuild);
        }
    }
    xml << closetag();

    for (int i = 0; i < tool.SingleProjects.size(); ++i) {
        const VCConfiguration &config = tool.SingleProjects.at(i).Configuration;

        xml << tag("ItemDefinitionGroup")
            << attrTag("Condition", generateCondition(config));

        // ClCompile
        write(xml, config.compiler);

        // Librarian / Linker
        if (config.ConfigurationType == typeStaticLibrary)
            write(xml, config.librarian);
        else
            write(xml, config.linker);

        // Midl
        write(xml, config.idl);

        // ResourceCompiler
        write(xml, config.resource);

        // Post build event
        if (config.postBuild.ExcludedFromBuild != unset)
            write(xml, config.postBuild);

        // Pre build event
        if (config.preBuild.ExcludedFromBuild != unset)
            write(xml, config.preBuild);

        // Pre link event
        if (config.preLink.ExcludedFromBuild != unset)
            write(xml, config.preLink);

        xml << closetag();

        // windeployqt
        if (!config.windeployqt.ExcludedFromBuild)
            write(xml, config.windeployqt);
    }

    // The file filters are added in a separate file for MSBUILD.
    QFile filterFile;
    filterFile.setFileName(Option::output.fileName().append(".filters"));
    if (!filterFile.open(QIODevice::WriteOnly | QIODevice::Text | QIODevice::Truncate)) {
        warn_msg(WarnLogic, "Cannot open output filter file");
        return;
    }
    QTextStream ts(&filterFile);
    XmlOutput xmlFilter(ts, XmlOutput::NoConversion);

    xmlFilter.setIndentString("  ");

    xmlFilter << decl("1.0", "utf-8")
              << tag("Project")
              << attrTagToolsVersion(tool.SingleProjects.first().Configuration)
              << attrTag("xmlns", "http://schemas.microsoft.com/developer/msbuild/2003");

    xmlFilter << tag("ItemGroup");

    addFilters(tool, xmlFilter, "Form Files");
    addFilters(tool, xmlFilter, "Generated Files");
    addFilters(tool, xmlFilter, "Header Files");
    addFilters(tool, xmlFilter, "LexYacc Files");
    addFilters(tool, xmlFilter, "Resource Files");
    addFilters(tool, xmlFilter, "Source Files");
    addFilters(tool, xmlFilter, "Translation Files");
    addFilters(tool, xmlFilter, "Deployment Files");
    addFilters(tool, xmlFilter, "Distribution Files");

    for (int x = 0; x < tool.ExtraCompilers.size(); ++x)
        addFilters(tool, xmlFilter, tool.ExtraCompilers.at(x));

    xmlFilter << closetag();

    outputFilter(tool, xml, xmlFilter, "Source Files");
    outputFilter(tool, xml, xmlFilter, "Header Files");
    outputFilter(tool, xml, xmlFilter, "Generated Files");
    outputFilter(tool, xml, xmlFilter, "LexYacc Files");
    outputFilter(tool, xml, xmlFilter, "Translation Files");
    outputFilter(tool, xml, xmlFilter, "Form Files");
    outputFilter(tool, xml, xmlFilter, "Resource Files");
    outputFilter(tool, xml, xmlFilter, "Deployment Files");
    outputFilter(tool, xml, xmlFilter, "Distribution Files");
    for (int x = 0; x < tool.ExtraCompilers.size(); ++x) {
        outputFilter(tool, xml, xmlFilter, tool.ExtraCompilers.at(x));
    }
    outputFilter(tool, xml, xmlFilter, "Root Files");

    xml << import("Project", "$(VCTargetsPath)\\Microsoft.Cpp.targets")
        << tag("ImportGroup")
        << attrTag("Label", "ExtensionTargets")
        << closetag();
}